

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void dumb_reset_resampler_n
               (int n,DUMB_RESAMPLER *resampler,void *src,int src_channels,int32 pos,int32 start,
               int32 end,int quality)

{
  undefined4 in_ECX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int32 in_stack_00000010;
  int32 in_stack_ffffffffffffffcc;
  int32 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_EDI == 8) {
    dumb_reset_resampler_8
              ((DUMB_RESAMPLER *)CONCAT44(in_ECX,in_R8D),
               (char *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_00000010,in_ESI);
  }
  else if (in_EDI == 0x10) {
    dumb_reset_resampler_16
              ((DUMB_RESAMPLER *)CONCAT44(in_ECX,in_R8D),
               (short *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_00000010,in_ESI);
  }
  else {
    dumb_reset_resampler
              ((DUMB_RESAMPLER *)CONCAT44(in_ECX,in_R8D),
               (sample_t_conflict *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_00000010,in_ESI);
  }
  return;
}

Assistant:

void dumb_reset_resampler_n(int n, DUMB_RESAMPLER *resampler, void *src, int src_channels, int32 pos, int32 start, int32 end, int quality)
{
	if (n == 8)
		dumb_reset_resampler_8(resampler, src, src_channels, pos, start, end, quality);
	else if (n == 16)
		dumb_reset_resampler_16(resampler, src, src_channels, pos, start, end, quality);
	else
		dumb_reset_resampler(resampler, src, src_channels, pos, start, end, quality);
}